

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O2

QPoint QHighDpi::fromNativePixels<QPoint,QScreen>(QPoint *value,QScreen *context)

{
  QPoint QVar1;
  double extraout_XMM0_Qa;
  
  QVar1 = (QPoint)QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  QVar1 = scale(value,1.0 / extraout_XMM0_Qa,QVar1);
  return QVar1;
}

Assistant:

T fromNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, qreal(1) / so.factor, so.origin);
}